

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O3

DataStream * __thiscall
DataStream::operator>>
          (DataStream *this,vector<unsigned_char,_secure_allocator<unsigned_char>_> *obj)

{
  long lVar1;
  pointer puVar2;
  uint uVar3;
  uint64_t uVar4;
  size_t in_RCX;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (obj->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((obj->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (obj->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  uVar4 = ReadCompactSize<DataStream>(this,true);
  uVar7 = (uint)uVar4;
  if (uVar7 != 0) {
    uVar6 = 0;
    do {
      uVar3 = uVar7 - uVar6;
      if (4999999 < uVar7 - uVar6) {
        uVar3 = 5000000;
      }
      uVar5 = uVar3 + uVar6;
      std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::resize(obj,(ulong)uVar5);
      read(this,uVar6 + (int)(obj->
                             super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start,(void *)(ulong)uVar3,in_RCX);
      uVar6 = uVar5;
    } while (uVar5 < uVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

DataStream& operator>>(T&& obj)
    {
        ::Unserialize(*this, obj);
        return (*this);
    }